

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void setup_superres(AV1_COMMON *cm,aom_read_bit_buffer *rb,int *width,int *height)

{
  int iVar1;
  aom_read_bit_buffer *in_RCX;
  aom_read_bit_buffer *in_RDX;
  long in_RDI;
  SequenceHeader *seq_params;
  int *height_00;
  
  *(undefined4 *)(in_RDI + 0x48) = *(undefined4 *)&in_RDX->bit_buffer;
  *(undefined4 *)(in_RDI + 0x4c) = *(undefined4 *)&in_RCX->bit_buffer;
  height_00 = *(int **)(in_RDI + 0x6088);
  if (*(char *)((long)height_00 + 0x42) != '\0') {
    iVar1 = aom_rb_read_bit(in_RDX);
    if (iVar1 == 0) {
      *(undefined1 *)(in_RDI + 0x50) = 8;
    }
    else {
      iVar1 = aom_rb_read_literal(in_RCX,(int)((ulong)height_00 >> 0x20));
      *(char *)(in_RDI + 0x50) = (char)iVar1;
      *(char *)(in_RDI + 0x50) = *(char *)(in_RDI + 0x50) + '\t';
      av1_calculate_scaled_superres_size((int *)in_RCX,height_00,0);
    }
  }
  return;
}

Assistant:

static inline void setup_superres(AV1_COMMON *const cm,
                                  struct aom_read_bit_buffer *rb, int *width,
                                  int *height) {
  cm->superres_upscaled_width = *width;
  cm->superres_upscaled_height = *height;

  const SequenceHeader *const seq_params = cm->seq_params;
  if (!seq_params->enable_superres) return;

  if (aom_rb_read_bit(rb)) {
    cm->superres_scale_denominator =
        (uint8_t)aom_rb_read_literal(rb, SUPERRES_SCALE_BITS);
    cm->superres_scale_denominator += SUPERRES_SCALE_DENOMINATOR_MIN;
    // Don't edit cm->width or cm->height directly, or the buffers won't get
    // resized correctly
    av1_calculate_scaled_superres_size(width, height,
                                       cm->superres_scale_denominator);
  } else {
    // 1:1 scaling - ie. no scaling, scale not provided
    cm->superres_scale_denominator = SCALE_NUMERATOR;
  }
}